

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool __thiscall
wallet::WalletBatch::WriteWatchOnly(WalletBatch *this,CScript *dest,CKeyMetadata *keyMeta)

{
  bool bVar1;
  byte bVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CScript>
  *in_RDI;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CScript>
  *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  undefined8 in_stack_ffffffffffffff28;
  undefined1 uVar3;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  WalletBatch *this_00;
  bool local_8a;
  undefined1 local_88 [64];
  WalletBatch local_48 [4];
  long local_8;
  
  uVar3 = (undefined1)((ulong)in_stack_ffffffffffffff28 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = local_48;
  std::make_pair<std::__cxx11::string_const&,CScript_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             (CScript *)in_stack_ffffffffffffff18);
  bVar1 = WriteIC<std::pair<std::__cxx11::string,CScript>,wallet::CKeyMetadata>
                    (this_00,in_RDI,
                     (CKeyMetadata *)
                     CONCAT17(in_stack_ffffffffffffff37,
                              CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
                     (bool)uVar3);
  bVar2 = bVar1 ^ 0xff;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CScript>::
  ~pair(in_stack_ffffffffffffff18);
  if ((bVar2 & 1) == 0) {
    uVar3 = (undefined1)((ulong)local_88 >> 0x38);
    std::make_pair<std::__cxx11::string_const&,CScript_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (CScript *)in_stack_ffffffffffffff18);
    local_8a = WriteIC<std::pair<std::__cxx11::string,CScript>,unsigned_char>
                         (this_00,in_RDI,
                          (uchar *)CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffff36,
                                                           in_stack_ffffffffffffff30)),(bool)uVar3);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CScript>::
    ~pair(in_stack_ffffffffffffff18);
  }
  else {
    local_8a = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_8a;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteWatchOnly(const CScript &dest, const CKeyMetadata& keyMeta)
{
    if (!WriteIC(std::make_pair(DBKeys::WATCHMETA, dest), keyMeta)) {
        return false;
    }
    return WriteIC(std::make_pair(DBKeys::WATCHS, dest), uint8_t{'1'});
}